

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall
ByteCodeGenerator::TrackFunctionDeclarationPropertyForDebugger
          (ByteCodeGenerator *this,Symbol *functionDeclarationSymbol,FuncInfo *funcInfoParent)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (functionDeclarationSymbol == (Symbol *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1a3,"(functionDeclarationSymbol)","functionDeclarationSymbol");
    if (!bVar2) goto LAB_007f972f;
    *puVar3 = 0;
  }
  if (funcInfoParent == (FuncInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1a4,"(funcInfoParent)","funcInfoParent");
    if (!bVar2) goto LAB_007f972f;
    *puVar3 = 0;
  }
  if ((functionDeclarationSymbol->field_0x42 & 2) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1a5,"(functionDeclarationSymbol->GetIsBlockVar())",
                       "We should only track inner function let bindings for the debugger.");
    if (!bVar2) {
LAB_007f972f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = Symbol::IsInSlot(functionDeclarationSymbol,this,funcInfoParent,false);
  if (!bVar2) {
    TrackRegisterPropertyForDebugger
              (this,(this->m_writer).m_currentDebuggerScope,functionDeclarationSymbol,funcInfoParent
               ,0,true);
    return;
  }
  if ((functionDeclarationSymbol->scope->field_0x44 & 2) == 0) {
    Symbol::EnsureScopeSlot(functionDeclarationSymbol,this,funcInfoParent);
    Symbol::EnsurePosition(functionDeclarationSymbol,this);
    TrackSlotArrayPropertyForDebugger
              (this,(this->m_writer).m_currentDebuggerScope,functionDeclarationSymbol,
               functionDeclarationSymbol->position,0,true);
    return;
  }
  TrackActivationObjectPropertyForDebugger
            (this,(this->m_writer).m_currentDebuggerScope,functionDeclarationSymbol,0,true);
  return;
}

Assistant:

void ByteCodeGenerator::TrackFunctionDeclarationPropertyForDebugger(Symbol *functionDeclarationSymbol, FuncInfo *funcInfoParent)
{
    Assert(functionDeclarationSymbol);
    Assert(funcInfoParent);
    AssertMsg(functionDeclarationSymbol->GetIsBlockVar(), "We should only track inner function let bindings for the debugger.");

    // Note: we don't have to check symbol->GetIsTrackedForDebugger, as we are not doing actual work here,
    //       which is done in other Track* functions that we call.

    if (functionDeclarationSymbol->IsInSlot(this, funcInfoParent))
    {
        if (functionDeclarationSymbol->GetScope()->GetIsObject())
        {
            this->TrackActivationObjectPropertyForDebugger(
                this->Writer()->GetCurrentDebuggerScope(),
                functionDeclarationSymbol,
                Js::DebuggerScopePropertyFlags_None,
                true /*isFunctionDeclaration*/);
        }
        else
        {
            // Make sure the property has a slot. This will bump up the size of the slot array if necessary.
            // Note that slot array inner function bindings are tracked even in non-debug mode in order
            // to keep the lifetime of the closure binding that could escape around for heap enumeration.
            functionDeclarationSymbol->EnsureScopeSlot(this, funcInfoParent);
            functionDeclarationSymbol->EnsurePosition(this);
            this->TrackSlotArrayPropertyForDebugger(
                this->Writer()->GetCurrentDebuggerScope(),
                functionDeclarationSymbol,
                functionDeclarationSymbol->GetPosition(),
                Js::DebuggerScopePropertyFlags_None,
                true /*isFunctionDeclaration*/);
        }
    }
    else
    {
        this->TrackRegisterPropertyForDebugger(
            this->Writer()->GetCurrentDebuggerScope(),
            functionDeclarationSymbol,
            funcInfoParent,
            Js::DebuggerScopePropertyFlags_None,
            true /*isFunctionDeclaration*/);
    }
}